

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_comparison_suite.cpp
# Opt level: O0

void equality_suite::compare_array_equal_array(void)

{
  size_type sVar1;
  basic_variable<std::allocator<char>_> *pbVar2;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init_00;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init_01;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init_02;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init_03;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init_04;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init_05;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init_06;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init_07;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init_08;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init_09;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init_10;
  basic_variable<std::allocator<char>_> *local_da8;
  basic_variable<std::allocator<char>_> *local_d90;
  basic_variable<std::allocator<char>_> *local_d78;
  basic_variable<std::allocator<char>_> *local_d60;
  basic_variable<std::allocator<char>_> *local_d48;
  basic_variable<std::allocator<char>_> *local_d30;
  basic_variable<std::allocator<char>_> *local_d18;
  basic_variable<std::allocator<char>_> *local_d00;
  basic_variable<std::allocator<char>_> *local_ce8;
  basic_variable<std::allocator<char>_> *local_cd0;
  basic_variable<std::allocator<char>_> *local_cb8;
  basic_variable<std::allocator<char>_> *local_ca0;
  undefined1 local_c91;
  basic_variable<std::allocator<char>_> *local_c90;
  basic_variable<std::allocator<char>_> local_c88;
  basic_variable<std::allocator<char>_> local_c58;
  basic_variable<std::allocator<char>_> local_c28;
  basic_variable<std::allocator<char>_> local_bf8;
  undefined1 local_bc8 [72];
  basic_variable<std::allocator<char>_> *local_b80;
  basic_variable<std::allocator<char>_> local_b78;
  basic_variable<std::allocator<char>_> local_b48;
  basic_variable<std::allocator<char>_> local_b18;
  basic_variable<std::allocator<char>_> local_ae8;
  undefined1 local_ab8 [69];
  undefined1 local_a73 [2];
  undefined1 local_a71;
  basic_variable<std::allocator<char>_> *local_a70;
  basic_variable<std::allocator<char>_> local_a68;
  basic_variable<std::allocator<char>_> local_a38;
  basic_variable<std::allocator<char>_> local_a08;
  basic_variable<std::allocator<char>_> local_9d8;
  undefined1 local_9a8 [72];
  basic_variable<std::allocator<char>_> *local_960;
  basic_variable<std::allocator<char>_> local_958;
  basic_variable<std::allocator<char>_> local_928;
  basic_variable<std::allocator<char>_> local_8f8;
  basic_variable<std::allocator<char>_> local_8c8;
  undefined1 local_898 [69];
  undefined1 local_853 [2];
  undefined1 local_851;
  basic_variable<std::allocator<char>_> *local_850;
  basic_variable<std::allocator<char>_> local_848;
  basic_variable<std::allocator<char>_> local_818;
  basic_variable<std::allocator<char>_> local_7e8;
  basic_variable<std::allocator<char>_> local_7b8;
  undefined1 local_788 [72];
  basic_variable<std::allocator<char>_> *local_740;
  basic_variable<std::allocator<char>_> local_738;
  basic_variable<std::allocator<char>_> local_708;
  basic_variable<std::allocator<char>_> local_6d8;
  undefined1 local_6a8 [69];
  undefined1 local_663 [2];
  undefined1 local_661;
  basic_variable<std::allocator<char>_> *local_660;
  basic_variable<std::allocator<char>_> local_658;
  basic_variable<std::allocator<char>_> local_628;
  basic_variable<std::allocator<char>_> local_5f8;
  basic_variable<std::allocator<char>_> local_5c8;
  undefined1 local_598 [72];
  basic_variable<std::allocator<char>_> *local_550;
  basic_variable<std::allocator<char>_> local_548;
  basic_variable<std::allocator<char>_> local_518;
  basic_variable<std::allocator<char>_> local_4e8;
  undefined1 local_4b8 [69];
  undefined1 local_473 [2];
  undefined1 local_471;
  basic_variable<std::allocator<char>_> *local_470;
  basic_variable<std::allocator<char>_> local_468;
  basic_variable<std::allocator<char>_> local_438;
  basic_variable<std::allocator<char>_> local_408;
  undefined1 local_3d8 [72];
  basic_variable<std::allocator<char>_> *local_390;
  basic_variable<std::allocator<char>_> local_388;
  basic_variable<std::allocator<char>_> local_358;
  basic_variable<std::allocator<char>_> local_328;
  undefined1 local_2f8 [69];
  undefined1 local_2b3 [2];
  undefined1 local_2b1;
  basic_variable<std::allocator<char>_> *local_2b0;
  basic_variable<std::allocator<char>_> local_2a8;
  basic_variable<std::allocator<char>_> local_278;
  basic_variable<std::allocator<char>_> local_248;
  undefined1 local_218 [72];
  basic_variable<std::allocator<char>_> *local_1d0;
  basic_variable<std::allocator<char>_> local_1c8;
  basic_variable<std::allocator<char>_> local_198;
  basic_variable<std::allocator<char>_> local_168;
  undefined1 local_138 [77];
  undefined1 local_eb [2];
  undefined1 local_e9;
  basic_variable<std::allocator<char>_> local_e8;
  basic_variable<std::allocator<char>_> local_b8;
  undefined1 local_87 [2];
  undefined1 local_85 [13];
  basic_variable<std::allocator<char>_> local_78;
  basic_variable<std::allocator<char>_> local_48;
  undefined1 local_a [2];
  
  trial::dynamic::basic_array<std::allocator<char>_>::make();
  trial::dynamic::basic_array<std::allocator<char>_>::make();
  local_a[0] = trial::dynamic::operator==(&local_48,&local_78);
  local_85[0] = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("array::make() == array::make()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xd72,"void equality_suite::compare_array_equal_array()",local_a,local_85);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_78);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_48);
  trial::dynamic::basic_array<std::allocator<char>_>::make();
  trial::dynamic::basic_array<std::allocator<char>_>::make();
  local_87[0] = trial::dynamic::operator!=(&local_b8,&local_e8);
  local_e9 = 0;
  sVar1 = 0xd73;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("array::make() != array::make()","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xd73,"void equality_suite::compare_array_equal_array()",local_87,&local_e9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_e8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_b8);
  local_1d0 = &local_1c8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_1d0,1);
  local_1d0 = &local_198;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_1d0,2);
  local_1d0 = &local_168;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_1d0,3);
  local_138._0_8_ = &local_1c8;
  local_138._8_8_ = 3;
  init._M_len = sVar1;
  init._M_array = (iterator)0x3;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_138 + 0x10),
             (basic_array<std::allocator<char>_> *)local_138._0_8_,init);
  local_2b0 = &local_2a8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_2b0,1);
  local_2b0 = &local_278;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_2b0,2);
  local_2b0 = &local_248;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_2b0,3);
  local_218._0_8_ = &local_2a8;
  local_218._8_8_ = 3;
  init_00._M_len = sVar1;
  init_00._M_array = (iterator)0x3;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_218 + 0x10),
             (basic_array<std::allocator<char>_> *)local_218._0_8_,init_00);
  local_eb[0] = trial::dynamic::operator==
                          ((basic_variable<std::allocator<char>_> *)(local_138 + 0x10),
                           (basic_variable<std::allocator<char>_> *)(local_218 + 0x10));
  local_2b1 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("array::make({ 1, 2, 3 }) == array::make({ 1, 2, 3 })","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xd74,"void equality_suite::compare_array_equal_array()",local_eb,&local_2b1);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_218 + 0x10));
  local_ca0 = (basic_variable<std::allocator<char>_> *)local_218;
  do {
    local_ca0 = local_ca0 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_ca0);
  } while (local_ca0 != &local_2a8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_138 + 0x10));
  pbVar2 = &local_1c8;
  local_cb8 = (basic_variable<std::allocator<char>_> *)local_138;
  do {
    local_cb8 = local_cb8 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_cb8);
  } while (local_cb8 != pbVar2);
  local_390 = &local_388;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_390,1);
  local_390 = &local_358;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_390,2);
  local_390 = &local_328;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_390,3);
  local_2f8._0_8_ = &local_388;
  local_2f8._8_8_ = 3;
  init_01._M_len = (size_type)pbVar2;
  init_01._M_array = (iterator)0x3;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_2f8 + 0x10),
             (basic_array<std::allocator<char>_> *)local_2f8._0_8_,init_01);
  local_470 = &local_468;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_470,1);
  local_470 = &local_438;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_470,2);
  local_470 = &local_408;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_470,3);
  local_3d8._0_8_ = &local_468;
  local_3d8._8_8_ = 3;
  init_02._M_len = (size_type)pbVar2;
  init_02._M_array = (iterator)0x3;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_3d8 + 0x10),
             (basic_array<std::allocator<char>_> *)local_3d8._0_8_,init_02);
  local_2b3[0] = trial::dynamic::operator!=
                           ((basic_variable<std::allocator<char>_> *)(local_2f8 + 0x10),
                            (basic_variable<std::allocator<char>_> *)(local_3d8 + 0x10));
  local_471 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("array::make({ 1, 2, 3 }) != array::make({ 1, 2, 3 })","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xd75,"void equality_suite::compare_array_equal_array()",local_2b3,&local_471);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_3d8 + 0x10));
  local_cd0 = (basic_variable<std::allocator<char>_> *)local_3d8;
  do {
    local_cd0 = local_cd0 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_cd0);
  } while (local_cd0 != &local_468);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_2f8 + 0x10));
  pbVar2 = &local_388;
  local_ce8 = (basic_variable<std::allocator<char>_> *)local_2f8;
  do {
    local_ce8 = local_ce8 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_ce8);
  } while (local_ce8 != pbVar2);
  local_550 = &local_548;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_550,1);
  local_550 = &local_518;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_550,2);
  local_550 = &local_4e8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_550,3);
  local_4b8._0_8_ = &local_548;
  local_4b8._8_8_ = 3;
  init_03._M_len = (size_type)pbVar2;
  init_03._M_array = (iterator)0x3;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_4b8 + 0x10),
             (basic_array<std::allocator<char>_> *)local_4b8._0_8_,init_03);
  local_660 = &local_658;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_660,1);
  local_660 = &local_628;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_660,2);
  local_660 = &local_5f8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_660,3);
  local_660 = &local_5c8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_660,4);
  local_598._0_8_ = &local_658;
  local_598._8_8_ = 4;
  init_04._M_len = (size_type)pbVar2;
  init_04._M_array = (iterator)0x4;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_598 + 0x10),
             (basic_array<std::allocator<char>_> *)local_598._0_8_,init_04);
  local_473[0] = trial::dynamic::operator==
                           ((basic_variable<std::allocator<char>_> *)(local_4b8 + 0x10),
                            (basic_variable<std::allocator<char>_> *)(local_598 + 0x10));
  local_661 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("array::make({ 1, 2, 3 }) == array::make({ 1, 2, 3, 4 })","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xd78,"void equality_suite::compare_array_equal_array()",local_473,&local_661);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_598 + 0x10));
  local_d00 = (basic_variable<std::allocator<char>_> *)local_598;
  do {
    local_d00 = local_d00 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_d00);
  } while (local_d00 != &local_658);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_4b8 + 0x10));
  pbVar2 = &local_548;
  local_d18 = (basic_variable<std::allocator<char>_> *)local_4b8;
  do {
    local_d18 = local_d18 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_d18);
  } while (local_d18 != pbVar2);
  local_740 = &local_738;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_740,1);
  local_740 = &local_708;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_740,2);
  local_740 = &local_6d8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_740,3);
  local_6a8._0_8_ = &local_738;
  local_6a8._8_8_ = 3;
  init_05._M_len = (size_type)pbVar2;
  init_05._M_array = (iterator)0x3;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_6a8 + 0x10),
             (basic_array<std::allocator<char>_> *)local_6a8._0_8_,init_05);
  local_850 = &local_848;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_850,1);
  local_850 = &local_818;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_850,2);
  local_850 = &local_7e8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_850,3);
  local_850 = &local_7b8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_850,4);
  local_788._0_8_ = &local_848;
  local_788._8_8_ = 4;
  init_06._M_len = (size_type)pbVar2;
  init_06._M_array = (iterator)0x4;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_788 + 0x10),
             (basic_array<std::allocator<char>_> *)local_788._0_8_,init_06);
  local_663[0] = trial::dynamic::operator!=
                           ((basic_variable<std::allocator<char>_> *)(local_6a8 + 0x10),
                            (basic_variable<std::allocator<char>_> *)(local_788 + 0x10));
  local_851 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("array::make({ 1, 2, 3 }) != array::make({ 1, 2, 3, 4 })","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xd79,"void equality_suite::compare_array_equal_array()",local_663,&local_851);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_788 + 0x10));
  local_d30 = (basic_variable<std::allocator<char>_> *)local_788;
  do {
    local_d30 = local_d30 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_d30);
  } while (local_d30 != &local_848);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_6a8 + 0x10));
  pbVar2 = &local_738;
  local_d48 = (basic_variable<std::allocator<char>_> *)local_6a8;
  do {
    local_d48 = local_d48 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_d48);
  } while (local_d48 != pbVar2);
  local_960 = &local_958;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_960,1);
  local_960 = &local_928;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_960,2);
  local_960 = &local_8f8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_960,3);
  local_960 = &local_8c8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_960,5);
  local_898._0_8_ = &local_958;
  local_898._8_8_ = 4;
  init_07._M_len = (size_type)pbVar2;
  init_07._M_array = (iterator)0x4;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_898 + 0x10),
             (basic_array<std::allocator<char>_> *)local_898._0_8_,init_07);
  local_a70 = &local_a68;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_a70,1);
  local_a70 = &local_a38;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_a70,2);
  local_a70 = &local_a08;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_a70,3);
  local_a70 = &local_9d8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_a70,4);
  local_9a8._0_8_ = &local_a68;
  local_9a8._8_8_ = 4;
  init_08._M_len = (size_type)pbVar2;
  init_08._M_array = (iterator)0x4;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_9a8 + 0x10),
             (basic_array<std::allocator<char>_> *)local_9a8._0_8_,init_08);
  local_853[0] = trial::dynamic::operator==
                           ((basic_variable<std::allocator<char>_> *)(local_898 + 0x10),
                            (basic_variable<std::allocator<char>_> *)(local_9a8 + 0x10));
  local_a71 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("array::make({ 1, 2, 3, 5 }) == array::make({ 1, 2, 3, 4 })","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xd7c,"void equality_suite::compare_array_equal_array()",local_853,&local_a71);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_9a8 + 0x10));
  local_d60 = (basic_variable<std::allocator<char>_> *)local_9a8;
  do {
    local_d60 = local_d60 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_d60);
  } while (local_d60 != &local_a68);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_898 + 0x10));
  pbVar2 = &local_958;
  local_d78 = (basic_variable<std::allocator<char>_> *)local_898;
  do {
    local_d78 = local_d78 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_d78);
  } while (local_d78 != pbVar2);
  local_b80 = &local_b78;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_b80,1);
  local_b80 = &local_b48;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_b80,2);
  local_b80 = &local_b18;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_b80,3);
  local_b80 = &local_ae8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_b80,5);
  local_ab8._0_8_ = &local_b78;
  local_ab8._8_8_ = 4;
  init_09._M_len = (size_type)pbVar2;
  init_09._M_array = (iterator)0x4;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_ab8 + 0x10),
             (basic_array<std::allocator<char>_> *)local_ab8._0_8_,init_09);
  local_c90 = &local_c88;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_c90,1);
  local_c90 = &local_c58;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_c90,2);
  local_c90 = &local_c28;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_c90,3);
  local_c90 = &local_bf8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_c90,4);
  local_bc8._0_8_ = &local_c88;
  local_bc8._8_8_ = 4;
  init_10._M_len = (size_type)pbVar2;
  init_10._M_array = (iterator)0x4;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_bc8 + 0x10),
             (basic_array<std::allocator<char>_> *)local_bc8._0_8_,init_10);
  local_a73[0] = trial::dynamic::operator!=
                           ((basic_variable<std::allocator<char>_> *)(local_ab8 + 0x10),
                            (basic_variable<std::allocator<char>_> *)(local_bc8 + 0x10));
  local_c91 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("array::make({ 1, 2, 3, 5 }) != array::make({ 1, 2, 3, 4 })","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xd7d,"void equality_suite::compare_array_equal_array()",local_a73,&local_c91);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_bc8 + 0x10));
  local_d90 = (basic_variable<std::allocator<char>_> *)local_bc8;
  do {
    local_d90 = local_d90 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_d90);
  } while (local_d90 != &local_c88);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_ab8 + 0x10));
  local_da8 = (basic_variable<std::allocator<char>_> *)local_ab8;
  do {
    local_da8 = local_da8 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_da8);
  } while (local_da8 != &local_b78);
  return;
}

Assistant:

void compare_array_equal_array()
{
    TRIAL_PROTOCOL_TEST_EQUAL(array::make() == array::make(), true);
    TRIAL_PROTOCOL_TEST_EQUAL(array::make() != array::make(), false);
    TRIAL_PROTOCOL_TEST_EQUAL(array::make({ 1, 2, 3 }) == array::make({ 1, 2, 3 }), true);
    TRIAL_PROTOCOL_TEST_EQUAL(array::make({ 1, 2, 3 }) != array::make({ 1, 2, 3 }), false);

    // Different sizes
    TRIAL_PROTOCOL_TEST_EQUAL(array::make({ 1, 2, 3 }) == array::make({ 1, 2, 3, 4 }), false);
    TRIAL_PROTOCOL_TEST_EQUAL(array::make({ 1, 2, 3 }) != array::make({ 1, 2, 3, 4 }), true);

    // Different content
    TRIAL_PROTOCOL_TEST_EQUAL(array::make({ 1, 2, 3, 5 }) == array::make({ 1, 2, 3, 4 }), false);
    TRIAL_PROTOCOL_TEST_EQUAL(array::make({ 1, 2, 3, 5 }) != array::make({ 1, 2, 3, 4 }), true);
}